

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_fits.c
# Opt level: O0

void sfts_write_comment(sfts_t *f,char *cmnt)

{
  char *errtext;
  long in_RSI;
  long in_RDI;
  int *in_stack_00000008;
  char *in_stack_00000010;
  char *_base;
  char _msg [31];
  undefined1 local_38 [30];
  undefined1 local_1a;
  long local_8;
  
  if (in_RSI == 0) {
    _p2sc_msg("sfts_write_comment",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
              ,0x1d4,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x12c0,"NULL comment");
    exit(1);
  }
  local_8 = in_RDI;
  ffpcom((fitsfile *)_base,in_stack_00000010,in_stack_00000008);
  if ((local_8 != 0) && (*(int *)(local_8 + 0x20) != 0)) {
    if (*(long *)(local_8 + 0x10) == 0) {
      errtext = (char *)g_strdup("memory");
    }
    else {
      errtext = (char *)g_path_get_basename(*(undefined8 *)(local_8 + 0x10));
    }
    ffgerr((int)((ulong)errtext >> 0x20),errtext);
    local_1a = 0;
    _p2sc_msg("sfts_write_comment",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
              ,0x1d8,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x11f8,"FITS: %s: %s",
              local_38,errtext);
    exit(1);
  }
  return;
}

Assistant:

void sfts_write_comment(sfts_t *f, const char *cmnt) {
    if (!cmnt) {
        P2SC_Msg(LVL_FATAL_INTERNAL_ERROR, "NULL comment");
        return;
    }
    fits_write_comment(f->fts, cmnt, &f->stat);
    CHK_FTS(f);
}